

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoclient.cpp
# Opt level: O1

void __thiscall EOClient::Send(EOClient *this,PacketBuilder *builder)

{
  size_type sVar1;
  ulong uVar2;
  string data;
  string local_80;
  string local_60;
  string local_40;
  
  PacketBuilder::operator_cast_to_string(&local_80,builder);
  PacketProcessor::Encode(&local_60,&this->processor,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (this->upload_fh == (FILE *)0x0) {
    PacketBuilder::operator_cast_to_string(&local_40,builder);
    PacketProcessor::Encode(&local_80,&this->processor,&local_40);
    Client::Send(&this->super_Client,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    sVar1 = (this->send_buffer2)._M_string_length;
    if (sVar1 - this->send_buffer2_used < local_60._M_string_length) {
      Client::Close(&this->super_Client,true);
    }
    else {
      if (local_60._M_string_length != 0) {
        uVar2 = 0;
        do {
          (this->send_buffer2)._M_dataplus._M_p[this->send_buffer2_ppos] =
               local_60._M_dataplus._M_p[uVar2];
          this->send_buffer2_ppos = this->send_buffer2_ppos + 1 & sVar1 - 1;
          uVar2 = uVar2 + 1;
        } while (uVar2 < local_60._M_string_length);
      }
      this->send_buffer2_used = this->send_buffer2_used + local_60._M_string_length;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void EOClient::Send(const PacketBuilder &builder)
{
	std::string data= this->processor.Encode(builder);

	if (this->upload_fh)
	{
		// Stick any incoming data in to our temporary buffer
		if (data.length() > this->send_buffer2.length() - this->send_buffer2_used)
		{
			this->Close(true);
			return;
		}

		const std::size_t mask = this->send_buffer2.length() - 1;

		for (std::size_t i = 0; i < data.length(); ++i)
		{
			this->send_buffer2[this->send_buffer2_ppos] = data[i];
			this->send_buffer2_ppos = (this->send_buffer2_ppos + 1) & mask;
		}

		this->send_buffer2_used += data.length();
	}
	else
	{
		Client::Send(this->processor.Encode(builder));
	}
}